

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

adaptive_arith_data_model * __thiscall
lzham::adaptive_arith_data_model::operator=
          (adaptive_arith_data_model *this,adaptive_arith_data_model *rhs)

{
  this->m_total_syms = rhs->m_total_syms;
  vector<lzham::adaptive_bit_model>::operator=(&this->m_probs,&rhs->m_probs);
  return this;
}

Assistant:

adaptive_arith_data_model& adaptive_arith_data_model::operator= (const adaptive_arith_data_model& rhs)
   {
      m_total_syms = rhs.m_total_syms;
      m_probs = rhs.m_probs;
      return *this;
   }